

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CondEpsGen.h
# Opt level: O0

bool __thiscall
covenant::CondEpsGen<covenant::Sym>::addTrans(CondEpsGen<covenant::Sym> *this,int qi,int c,int qj)

{
  bool bVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  CondEpsGen<covenant::Sym> *in_RDI;
  iterator it;
  set<int,_std::less<int>,_std::allocator<int>_> *sing;
  CondEpsGen<covenant::Sym> *in_stack_00000070;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  vector<covenant::CondEpsGen<covenant::Sym>::prod_info,_std::allocator<covenant::CondEpsGen<covenant::Sym>::prod_info>_>
  *this_00;
  _Self local_50;
  _Base_ptr local_48;
  _Rb_tree_const_iterator<int> local_40;
  set<int,_std::less<int>,_std::allocator<int>_> *local_38;
  prod_info local_30;
  undefined8 uVar2;
  int p;
  
  this_00 = &in_RDI->decisions;
  local_30 = mk_prod(in_RDI,in_ESI,in_EDX,in_ECX);
  uVar2 = local_30._0_8_;
  p = local_30.s;
  std::
  vector<covenant::CondEpsGen<covenant::Sym>::prod_info,_std::allocator<covenant::CondEpsGen<covenant::Sym>::prod_info>_>
  ::push_back(this_00,(value_type *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  local_38 = map_set<int,_int,_boost::hash<int>,_std::equal_to<int>_>::operator[]
                       ((map_set<int,_int,_boost::hash<int>,_std::equal_to<int>_> *)this_00,
                        (int *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  std::_Rb_tree_const_iterator<int>::_Rb_tree_const_iterator(&local_40);
  local_48 = (_Base_ptr)
             std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)
                        CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  local_40._M_node = local_48;
  while( true ) {
    local_50._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::end
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)
                    CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    in_stack_ffffffffffffff9c = in_ESI;
    bVar1 = std::operator!=(&local_40,&local_50);
    if (!bVar1) break;
    in_ESI = in_stack_ffffffffffffff9c;
    std::_Rb_tree_const_iterator<int>::operator*((_Rb_tree_const_iterator<int> *)0x23cd3c);
    addProd((CondEpsGen<covenant::Sym> *)CONCAT44(in_ESI,in_EDX),in_ECX,p,
            (int)((ulong)uVar2 >> 0x20));
    std::_Rb_tree_const_iterator<int>::operator++((_Rb_tree_const_iterator<int> *)this_00);
  }
  bVar1 = update_prods(in_stack_00000070);
  return bVar1;
}

Assistant:

bool addTrans(int qi, int c, int qj)
    {
      // Update the automaton with a new transition.
      // Not presently checking if p[qi -> qj] alreacy
      // exists.
      decisions.push_back(mk_prod(qi, c, qj));
      
      set<int>& sing(digest.term_prods[c]);
      
      set<int>::iterator it;
      for(it = sing.begin(); it != sing.end(); ++it)
      {
        addProd(qi, *it, qj);
      }
      return update_prods();
    }